

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O0

void __thiscall btDbvt::collideTT(btDbvt *this,btDbvtNode *root0,btDbvtNode *root1,ICollide *policy)

{
  int iVar1;
  bool bVar2;
  sStkNN *psVar3;
  long *in_RCX;
  btDbvtNode *in_RDX;
  btDbvtNode *in_RSI;
  sStkNN p;
  btAlignedObjectArray<btDbvt::sStkNN> stkStack;
  int treshold;
  int depth;
  btAlignedObjectArray<btDbvt::sStkNN> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  btDbvtAabbMm *in_stack_fffffffffffffe48;
  btAlignedObjectArray<btDbvt::sStkNN> *in_stack_fffffffffffffe50;
  sStkNN local_148;
  sStkNN local_138;
  sStkNN local_128;
  sStkNN local_118;
  sStkNN local_108;
  sStkNN local_f8;
  sStkNN local_e8;
  sStkNN local_d8;
  sStkNN local_c8;
  sStkNN local_b8;
  sStkNN local_a8;
  sStkNN local_98;
  btDbvtNode *local_88;
  btDbvtNode *local_80;
  sStkNN local_78 [2];
  sStkNN local_58;
  btAlignedObjectArray<btDbvt::sStkNN> local_48;
  int local_28;
  int local_24;
  long *local_20;
  btDbvtNode *local_18;
  btDbvtNode *local_10;
  
  if ((in_RSI != (btDbvtNode *)0x0) && (in_RDX != (btDbvtNode *)0x0)) {
    local_24 = 1;
    local_28 = 0x7c;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    btAlignedObjectArray<btDbvt::sStkNN>::btAlignedObjectArray(in_stack_fffffffffffffe30);
    sStkNN::sStkNN(&local_58);
    btAlignedObjectArray<btDbvt::sStkNN>::resize
              (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (sStkNN *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    sStkNN::sStkNN(local_78,local_10,local_18);
    psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,0);
    psVar3->a = local_78[0].a;
    psVar3->b = local_78[0].b;
    do {
      local_24 = local_24 + -1;
      psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,local_24);
      local_88 = psVar3->a;
      local_80 = psVar3->b;
      if (local_28 < local_24) {
        btAlignedObjectArray<btDbvt::sStkNN>::size(&local_48);
        sStkNN::sStkNN(&local_98);
        btAlignedObjectArray<btDbvt::sStkNN>::resize
                  (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                   (sStkNN *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        local_28 = btAlignedObjectArray<btDbvt::sStkNN>::size(&local_48);
        local_28 = local_28 + -4;
      }
      if (local_88 == local_80) {
        bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x285267);
        if (bVar2) {
          sStkNN::sStkNN(&local_a8,(local_88->field_2).childs[0],(local_88->field_2).childs[0]);
          iVar1 = local_24;
          local_24 = local_24 + 1;
          psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
          psVar3->a = local_a8.a;
          psVar3->b = local_a8.b;
          sStkNN::sStkNN(&local_b8,(local_88->field_2).childs[1],(local_88->field_2).childs[1]);
          iVar1 = local_24;
          local_24 = local_24 + 1;
          psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
          psVar3->a = local_b8.a;
          psVar3->b = local_b8.b;
          sStkNN::sStkNN(&local_c8,(local_88->field_2).childs[0],(local_88->field_2).childs[1]);
          iVar1 = local_24;
          local_24 = local_24 + 1;
          psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
          psVar3->a = local_c8.a;
          psVar3->b = local_c8.b;
        }
      }
      else {
        bVar2 = Intersect((btDbvtAabbMm *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (bVar2) {
          bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x2853b3);
          if (bVar2) {
            bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x2853d3);
            if (bVar2) {
              sStkNN::sStkNN(&local_d8,(local_88->field_2).childs[0],(local_80->field_2).childs[0]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              psVar3->a = local_d8.a;
              psVar3->b = local_d8.b;
              sStkNN::sStkNN(&local_e8,(local_88->field_2).childs[1],(local_80->field_2).childs[0]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              psVar3->a = local_e8.a;
              psVar3->b = local_e8.b;
              sStkNN::sStkNN(&local_f8,(local_88->field_2).childs[0],(local_80->field_2).childs[1]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              psVar3->a = local_f8.a;
              psVar3->b = local_f8.b;
              sStkNN::sStkNN(&local_108,(local_88->field_2).childs[1],(local_80->field_2).childs[1])
              ;
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              psVar3->a = local_108.a;
              psVar3->b = local_108.b;
            }
            else {
              sStkNN::sStkNN(&local_118,(local_88->field_2).childs[0],local_80);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              in_stack_fffffffffffffe50 =
                   (btAlignedObjectArray<btDbvt::sStkNN> *)
                   btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              *(btDbvtNode **)in_stack_fffffffffffffe50 = local_118.a;
              *(btDbvtNode **)&in_stack_fffffffffffffe50->m_capacity = local_118.b;
              sStkNN::sStkNN(&local_128,(local_88->field_2).childs[1],local_80);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              in_stack_fffffffffffffe48 =
                   (btDbvtAabbMm *)btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1)
              ;
              *(btDbvtNode **)(in_stack_fffffffffffffe48->mi).m_floats = local_128.a;
              *(btDbvtNode **)((long)(in_stack_fffffffffffffe48->mi).m_floats + 8) = local_128.b;
            }
          }
          else {
            in_stack_fffffffffffffe47 = btDbvtNode::isinternal((btDbvtNode *)0x28563b);
            if ((bool)in_stack_fffffffffffffe47) {
              sStkNN::sStkNN(&local_138,local_88,(local_80->field_2).childs[0]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              psVar3->a = local_138.a;
              psVar3->b = local_138.b;
              sStkNN::sStkNN(&local_148,local_88,(local_80->field_2).childs[1]);
              iVar1 = local_24;
              local_24 = local_24 + 1;
              psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
              psVar3->a = local_148.a;
              psVar3->b = local_148.b;
            }
            else {
              (**(code **)(*local_20 + 0x10))(local_20,local_88,local_80);
            }
          }
        }
      }
    } while (local_24 != 0);
    btAlignedObjectArray<btDbvt::sStkNN>::~btAlignedObjectArray
              ((btAlignedObjectArray<btDbvt::sStkNN> *)0x285756);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTT(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-4;
			btAlignedObjectArray<sStkNN>	stkStack;
			stkStack.resize(DOUBLE_STACKSIZE);
			stkStack[0]=sStkNN(root0,root1);
			do	{		
				sStkNN	p=stkStack[--depth];
				if(depth>treshold)
				{
					stkStack.resize(stkStack.size()*2);
					treshold=stkStack.size()-4;
				}
				if(p.a==p.b)
				{
					if(p.a->isinternal())
					{
						stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[0]);
						stkStack[depth++]=sStkNN(p.a->childs[1],p.a->childs[1]);
						stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[1]);
					}
				}
				else if(Intersect(p.a->volume,p.b->volume))
				{
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[1]);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=sStkNN(p.a,p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							policy.Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}